

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::tracker_request::tracker_request(tracker_request *this,tracker_request *param_1)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  pointer paVar7;
  pointer paVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  context *pcVar12;
  uint16_t uVar13;
  event_t eVar14;
  tracker_request_flags_t tVar15;
  uint32_t uVar16;
  bool bVar17;
  undefined6 uVar18;
  
  ::std::__cxx11::string::string((string *)this,(string *)param_1);
  ::std::__cxx11::string::string((string *)&this->trackerid,(string *)&param_1->trackerid);
  (this->filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (param_1->filter).
           super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (param_1->filter).
           super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (param_1->filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar1;
  (this->filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (param_1->filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  this->num_want = param_1->num_want;
  iVar3 = param_1->downloaded;
  iVar4 = param_1->uploaded;
  iVar5 = param_1->left;
  iVar6 = param_1->corrupt;
  uVar13 = param_1->listen_port;
  eVar14 = param_1->event;
  tVar15.m_val = (param_1->kind).m_val;
  uVar16 = param_1->key;
  this->redundant = param_1->redundant;
  this->listen_port = uVar13;
  this->event = eVar14;
  this->kind = (tracker_request_flags_t)tVar15.m_val;
  this->key = uVar16;
  this->left = iVar5;
  this->corrupt = iVar6;
  this->downloaded = iVar3;
  this->uploaded = iVar4;
  paVar7 = (param_1->ipv6).
           super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->ipv6).
  super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->ipv6).
       super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->ipv6).
  super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
  _M_impl.super__Vector_impl_data._M_finish = paVar7;
  (this->ipv6).
  super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->ipv6).
       super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->ipv6).
  super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->ipv6).
  super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->ipv6).
  super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar8 = (param_1->ipv4).
           super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->ipv4).
  super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->ipv4).
       super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->ipv4).
  super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
  _M_impl.super__Vector_impl_data._M_finish = paVar8;
  (this->ipv4).
  super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->ipv4).
       super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->ipv4).
  super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->ipv4).
  super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->ipv4).
  super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)((this->pid).m_number._M_elems + 3) =
       *(undefined8 *)((param_1->pid).m_number._M_elems + 3);
  uVar9 = *(undefined8 *)(param_1->info_hash).m_number._M_elems;
  uVar10 = *(undefined8 *)((param_1->info_hash).m_number._M_elems + 2);
  uVar11 = *(undefined8 *)((param_1->pid).m_number._M_elems + 1);
  *(undefined8 *)((this->info_hash).m_number._M_elems + 4) =
       *(undefined8 *)((param_1->info_hash).m_number._M_elems + 4);
  *(undefined8 *)((this->pid).m_number._M_elems + 1) = uVar11;
  *(undefined8 *)(this->info_hash).m_number._M_elems = uVar9;
  *(undefined8 *)((this->info_hash).m_number._M_elems + 2) = uVar10;
  p_Var2 = (param_1->outgoing_socket).m_sock.
           super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->outgoing_socket).m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param_1->outgoing_socket).m_sock.
       super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->outgoing_socket).m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (param_1->outgoing_socket).m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (param_1->outgoing_socket).m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->i2pconn = param_1->i2pconn;
  bVar17 = param_1->triggered_manually;
  uVar18 = *(undefined6 *)&param_1->field_0xf2;
  pcVar12 = param_1->ssl_ctx;
  this->private_torrent = param_1->private_torrent;
  this->triggered_manually = bVar17;
  *(undefined6 *)&this->field_0xf2 = uVar18;
  this->ssl_ctx = pcVar12;
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT tracker_request
	{
		tracker_request() = default;

		static inline constexpr tracker_request_flags_t scrape_request = 0_bit;

		// affects interpretation of peers string in HTTP response
		// see parse_tracker_response()
		static inline constexpr tracker_request_flags_t i2p = 1_bit;

		std::string url;
		std::string trackerid;
#if TORRENT_ABI_VERSION == 1
		std::string auth;
#endif

		std::shared_ptr<const ip_filter> filter;

		std::int64_t downloaded = -1;
		std::int64_t uploaded = -1;
		std::int64_t left = -1;
		std::int64_t corrupt = 0;
		std::int64_t redundant = 0;
		std::uint16_t listen_port = 0;
		event_t event = event_t::none;
		tracker_request_flags_t kind = {};

		std::uint32_t key = 0;
		int num_want = 0;
		std::vector<address_v6> ipv6;
		std::vector<address_v4> ipv4;
		sha1_hash info_hash;
		peer_id pid;

		aux::listen_socket_handle outgoing_socket;

		// set to true if the .torrent file this tracker announce is for is marked
		// as private (i.e. has the "priv": 1 key)
		bool private_torrent = false;

		// this is set to true if this request was triggered by a "manual" call to
		// scrape_tracker() or force_reannounce()
		bool triggered_manually = false;

#if TORRENT_USE_SSL
		ssl::context* ssl_ctx = nullptr;
#endif
#if TORRENT_USE_I2P
		i2p_connection* i2pconn = nullptr;
#endif
#if TORRENT_USE_RTC
		std::vector<aux::rtc_offer> offers;
#endif
	}